

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber
          (Minefield_Response_NACK_PDU *this,KUINT8 N)

{
  KUINT16 *pKVar1;
  KUINT8 local_9;
  
  local_9 = N;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vSeqNums,&local_9);
  this->m_ui8NumMisPdus = this->m_ui8NumMisPdus + '\x01';
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 1;
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber( KUINT8 N )
{
    m_vSeqNums.push_back( N );
    ++m_ui8NumMisPdus;
    ++m_ui16PDULength;
}